

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertTransformOrder_TRStoSRT
          (FBXConverter *this,aiQuatKey *out_quat,aiVectorKey *out_scale,
          aiVectorKey *out_translation,KeyFrameListList *scaling,KeyFrameListList *translation,
          KeyFrameListList *rotation,KeyTimeList *times,double *maxTime,double *minTime,
          RotOrder order,aiVector3D *def_scale,aiVector3D *def_translate,aiVector3D *def_rotation)

{
  float fVar1;
  pointer plVar2;
  aiVector3D *paVar3;
  ulong uVar4;
  float *pfVar5;
  FBXConverter *this_00;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  aiQuaternion aVar35;
  aiMatrix4x4t<float> local_88;
  KeyFrameListList *local_48;
  KeyFrameListList *local_40;
  float local_38;
  float local_34;
  
  local_48 = scaling;
  local_40 = translation;
  if ((rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar2) {
      pfVar5 = &(out_quat->mValue).y;
      uVar4 = 0;
      this_00 = (FBXConverter *)minTime;
      do {
        *(double *)(pfVar5 + -4) = ((double)plVar2[uVar4] / 46186158000.0) * this->anim_fps;
        aVar35 = EulerToQuaternion(this_00,def_rotation,order);
        *(aiQuaternion *)(pfVar5 + -2) = aVar35;
        uVar4 = uVar4 + 1;
        plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5 = pfVar5 + 6;
      } while (uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar2 >> 3))
      ;
    }
  }
  else {
    InterpolateKeys(this,out_quat,times,rotation,def_rotation,maxTime,minTime,order);
  }
  if ((local_48->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_48->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar2) {
      paVar3 = &out_scale->mValue;
      uVar4 = 0;
      do {
        *(double *)((long)(paVar3 + -1) + 4) =
             ((double)plVar2[uVar4] / 46186158000.0) * this->anim_fps;
        paVar3->z = def_scale->z;
        fVar9 = def_scale->y;
        paVar3->x = def_scale->x;
        paVar3->y = fVar9;
        uVar4 = uVar4 + 1;
        plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = paVar3 + 2;
      } while (uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar2 >> 3))
      ;
    }
  }
  else {
    InterpolateKeys(this,out_scale,times,local_48,def_scale,maxTime,minTime);
  }
  if ((local_40->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_40->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar2) {
      paVar3 = &out_translation->mValue;
      uVar4 = 0;
      do {
        *(double *)((long)(paVar3 + -1) + 4) =
             ((double)plVar2[uVar4] / 46186158000.0) * this->anim_fps;
        paVar3->z = def_translate->z;
        fVar9 = def_translate->y;
        paVar3->x = def_translate->x;
        paVar3->y = fVar9;
        uVar4 = uVar4 + 1;
        plVar2 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = paVar3 + 2;
      } while (uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar2 >> 3))
      ;
    }
  }
  else {
    InterpolateKeys(this,out_translation,times,local_40,def_translate,maxTime,minTime);
  }
  lVar7 = (long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar6 = 0;
    do {
      fVar9 = *(float *)((long)&(out_translation->mValue).x + lVar6);
      fVar17 = *(float *)((long)&(out_translation->mValue).y + lVar6);
      fVar8 = *(float *)((long)&(out_translation->mValue).z + lVar6);
      fVar23 = *(float *)((long)&(out_quat->mValue).y + lVar6);
      fVar13 = *(float *)((long)&(out_quat->mValue).z + lVar6);
      fVar1 = *(float *)((long)&(out_quat->mValue).x + lVar6);
      fVar10 = fVar23 * fVar23 + fVar13 * fVar13;
      fVar27 = 1.0 - (fVar10 + fVar10);
      fVar10 = *(float *)((long)&(out_quat->mValue).w + lVar6);
      fVar11 = fVar1 * fVar23 - fVar13 * fVar10;
      fVar11 = fVar11 + fVar11;
      fVar20 = fVar1 * fVar13 + fVar23 * fVar10;
      fVar12 = fVar13 * fVar10 + fVar1 * fVar23;
      fVar12 = fVar12 + fVar12;
      fVar15 = fVar13 * fVar13 + fVar1 * fVar1;
      local_34 = 1.0 - (fVar15 + fVar15);
      fVar15 = fVar13 * fVar23 - fVar1 * fVar10;
      fVar14 = fVar1 * fVar13 - fVar23 * fVar10;
      fVar14 = fVar14 + fVar14;
      fVar13 = fVar1 * fVar10 + fVar13 * fVar23;
      fVar13 = fVar13 + fVar13;
      fVar23 = fVar1 * fVar1 + fVar23 * fVar23;
      fVar23 = 1.0 - (fVar23 + fVar23);
      fVar20 = fVar20 + fVar20;
      fVar15 = fVar15 + fVar15;
      fVar24 = fVar9 + 0.0;
      fVar9 = fVar9 * 0.0;
      fVar31 = fVar14 * 0.0 + fVar12 * 0.0 + fVar27 + fVar9;
      fVar16 = fVar13 * 0.0 + local_34 * 0.0 + fVar11 + fVar9;
      fVar9 = fVar23 * 0.0 + fVar15 * 0.0 + fVar20 + fVar9;
      local_38 = fVar17 + 0.0;
      fVar17 = fVar17 * 0.0;
      fVar21 = fVar14 * 0.0 + fVar27 * 0.0 + fVar12 + fVar17;
      fVar32 = fVar13 * 0.0 + fVar11 * 0.0 + local_34 + fVar17;
      fVar17 = fVar23 * 0.0 + fVar20 * 0.0 + fVar15 + fVar17;
      fVar25 = fVar8 + 0.0;
      fVar8 = fVar8 * 0.0;
      fVar18 = fVar27 * 0.0 + fVar12 * 0.0 + fVar14 + fVar8;
      fVar19 = fVar11 * 0.0 + local_34 * 0.0 + fVar13 + fVar8;
      fVar8 = fVar20 * 0.0 + fVar15 * 0.0 + fVar23 + fVar8;
      fVar14 = fVar14 * 0.0 + fVar27 * 0.0 + fVar12 * 0.0 + 0.0;
      local_48 = (KeyFrameListList *)CONCAT44(local_48._4_4_,fVar14);
      fVar12 = fVar13 * 0.0 + fVar11 * 0.0 + local_34 * 0.0 + 0.0;
      fVar10 = fVar23 * 0.0 + fVar20 * 0.0 + fVar15 * 0.0 + 0.0;
      fVar15 = fVar16 * 0.0;
      fVar23 = *(float *)((long)&(out_scale->mValue).x + lVar6);
      fVar13 = *(float *)((long)&(out_scale->mValue).y + lVar6);
      fVar20 = fVar31 * 0.0;
      fVar28 = fVar20 + fVar15;
      fVar1 = *(float *)((long)&(out_scale->mValue).z + lVar6);
      fVar29 = fVar9 * 0.0;
      fVar11 = fVar24 * 0.0;
      local_88.a1 = fVar23 * fVar31 + fVar15 + fVar29 + fVar11;
      local_88.a2 = fVar16 * fVar13 + fVar20 + fVar29 + fVar11;
      local_40 = (KeyFrameListList *)CONCAT44(local_40._4_4_,local_88.a2);
      fVar15 = fVar32 * 0.0;
      fVar20 = fVar21 * 0.0;
      fVar22 = fVar20 + fVar15;
      fVar30 = fVar17 * 0.0;
      fVar16 = local_38 * 0.0;
      local_88.b2 = fVar32 * fVar13 + fVar20 + fVar30 + fVar16;
      fVar20 = fVar19 * 0.0;
      fVar27 = fVar18 * 0.0;
      fVar31 = fVar27 + fVar20;
      fVar33 = fVar8 * 0.0;
      fVar32 = fVar25 * 0.0;
      local_88.c3 = fVar1 * fVar8 + fVar31 + fVar32;
      fVar8 = fVar12 * 0.0;
      fVar34 = fVar14 * 0.0 + fVar8;
      fVar26 = fVar10 * 0.0;
      local_88.d4 = fVar34 + fVar26 + 1.0;
      local_88.a3 = fVar1 * fVar9 + fVar28 + fVar11;
      local_88.b1 = fVar23 * fVar21 + fVar15 + fVar30 + fVar16;
      local_88.a4 = fVar28 + fVar29 + fVar24;
      local_88.b4 = fVar22 + fVar30 + local_38;
      local_88.b3 = fVar1 * fVar17 + fVar22 + fVar16;
      local_88.c2 = fVar19 * fVar13 + fVar27 + fVar33 + fVar32;
      local_88.c1 = fVar23 * fVar18 + fVar20 + fVar33 + fVar32;
      local_88.d1 = fVar23 * fVar14 + fVar8 + fVar26 + 0.0;
      local_88.c4 = fVar31 + fVar33 + fVar25;
      local_88.d3 = fVar1 * fVar10 + fVar34 + 0.0;
      local_88.d2 = fVar12 * fVar13 + fVar14 * 0.0 + fVar26 + 0.0;
      aiMatrix4x4t<float>::Decompose
                (&local_88,(aiVector3t<float> *)((long)&(out_scale->mValue).x + lVar6),
                 (aiQuaterniont<float> *)((long)&(out_quat->mValue).w + lVar6),
                 (aiVector3t<float> *)((long)&(out_translation->mValue).x + lVar6));
      lVar6 = lVar6 + 0x18;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void FBXConverter::ConvertTransformOrder_TRStoSRT(aiQuatKey* out_quat, aiVectorKey* out_scale,
            aiVectorKey* out_translation,
            const KeyFrameListList& scaling,
            const KeyFrameListList& translation,
            const KeyFrameListList& rotation,
            const KeyTimeList& times,
            double& maxTime,
            double& minTime,
            Model::RotOrder order,
            const aiVector3D& def_scale,
            const aiVector3D& def_translate,
            const aiVector3D& def_rotation)
        {
            if (rotation.size()) {
                InterpolateKeys(out_quat, times, rotation, def_rotation, maxTime, minTime, order);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_quat[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_quat[i].mValue = EulerToQuaternion(def_rotation, order);
                }
            }

            if (scaling.size()) {
                InterpolateKeys(out_scale, times, scaling, def_scale, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_scale[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_scale[i].mValue = def_scale;
                }
            }

            if (translation.size()) {
                InterpolateKeys(out_translation, times, translation, def_translate, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_translation[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_translation[i].mValue = def_translate;
                }
            }

            const size_t count = times.size();
            for (size_t i = 0; i < count; ++i) {
                aiQuaternion& r = out_quat[i].mValue;
                aiVector3D& s = out_scale[i].mValue;
                aiVector3D& t = out_translation[i].mValue;

                aiMatrix4x4 mat, temp;
                aiMatrix4x4::Translation(t, mat);
                mat *= aiMatrix4x4(r.GetMatrix());
                mat *= aiMatrix4x4::Scaling(s, temp);

                mat.Decompose(s, r, t);
            }
        }